

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::GenerateNewKey
          (CPubKey *__return_storage_ptr__,LegacyScriptPubKeyMan *this,WalletBatch *batch,
          CHDChain *hd_chain,bool internal)

{
  WalletStorage *pWVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int64_t nCreateTime_;
  mapped_type *pmVar5;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long in_FS_OFFSET;
  CKey secret;
  CKeyMetadata metadata;
  undefined1 local_f8 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [16];
  size_type local_b8;
  undefined8 uStack_b0;
  CKeyMetadata local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar3 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((char)iVar3 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x43d,
                  "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
                 );
  }
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar3 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x200000000);
  if ((char)iVar3 == '\0') {
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar3 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,60000);
    local_f8[0] = false;
    local_f0._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )(_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    nCreateTime_ = GetTime();
    CKeyMetadata::CKeyMetadata(&local_a8,nCreateTime_);
    iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this);
    if ((char)iVar4 == '\0') {
      CKey::MakeNewKey((CKey *)local_f8,SUB41(iVar3,0));
    }
    else {
      pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      iVar4 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
      DeriveNewChildKey(this,batch,&local_a8,(CKey *)local_f8,hd_chain,
                        (bool)((byte)iVar4 & internal));
    }
    if (SUB41(iVar3,0) != false) {
      pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar1->_vptr_WalletStorage[7])(pWVar1,60000,0);
    }
    CKey::GetPubKey(__return_storage_ptr__,(CKey *)local_f8);
    bVar2 = CKey::VerifyPubKey((CKey *)local_f8,__return_storage_ptr__);
    if (bVar2) {
      CPubKey::GetID((CKeyID *)local_c8,__return_storage_ptr__);
      pmVar5 = std::
               map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
               ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)local_c8);
      pmVar5->nVersion = local_a8.nVersion;
      *(undefined4 *)&pmVar5->field_0x4 = local_a8._4_4_;
      pmVar5->nCreateTime = local_a8.nCreateTime;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&pmVar5->hdKeypath,&local_a8.hdKeypath);
      *(undefined4 *)
       ((pmVar5->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
           local_a8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_;
      *(undefined8 *)(pmVar5->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems =
           local_a8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_;
      *(undefined8 *)((pmVar5->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8)
           = local_a8.hd_seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._8_8_;
      *&(pmVar5->key_origin).fingerprint = local_a8.key_origin.fingerprint;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(pmVar5->key_origin).path,&local_a8.key_origin.path);
      pmVar5->has_key_origin = local_a8.has_key_origin;
      UpdateTimeFirstKey(this,nCreateTime_);
      bVar2 = AddKeyPubKeyWithDB(this,batch,(CKey *)local_f8,__return_storage_ptr__);
      if (bVar2) {
        if (local_a8.key_origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.key_origin.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.key_origin.path.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.key_origin.path.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.hdKeypath._M_dataplus._M_p != &local_a8.hdKeypath.field_2) {
          operator_delete(local_a8.hdKeypath._M_dataplus._M_p,
                          local_a8.hdKeypath.field_2._M_allocated_capacity + 1);
        }
        if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )local_f0._M_t.
              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
            (array<unsigned_char,_32UL> *)0x0) {
          SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                    ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_f0,
                     (array<unsigned_char,_32UL> *)
                     local_f0._M_t.
                     super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                     .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"GenerateNewKey","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_e8,": AddKey failed");
        local_c8._0_8_ = (pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._0_8_ == paVar7) {
          local_b8 = paVar7->_M_allocated_capacity;
          uStack_b0 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_c8._0_8_ = &local_b8;
        }
        else {
          local_b8 = paVar7->_M_allocated_capacity;
        }
        local_c8._8_8_ = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(this_00,(string *)local_c8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      __stack_chk_fail();
    }
    __assert_fail("secret.VerifyPubKey(pubkey)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x455,
                  "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
                 );
  }
  __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET)",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                ,0x43e,
                "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
               );
}

Assistant:

CPubKey LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &batch, CHDChain& hd_chain, bool internal)
{
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET));
    AssertLockHeld(cs_KeyStore);
    bool fCompressed = m_storage.CanSupportFeature(FEATURE_COMPRPUBKEY); // default to compressed public keys if we want 0.6.0 wallets

    CKey secret;

    // Create new metadata
    int64_t nCreationTime = GetTime();
    CKeyMetadata metadata(nCreationTime);

    // use HD key derivation if HD was enabled during wallet creation and a seed is present
    if (IsHDEnabled()) {
        DeriveNewChildKey(batch, metadata, secret, hd_chain, (m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? internal : false));
    } else {
        secret.MakeNewKey(fCompressed);
    }

    // Compressed public keys were introduced in version 0.6.0
    if (fCompressed) {
        m_storage.SetMinVersion(FEATURE_COMPRPUBKEY);
    }

    CPubKey pubkey = secret.GetPubKey();
    assert(secret.VerifyPubKey(pubkey));

    mapKeyMetadata[pubkey.GetID()] = metadata;
    UpdateTimeFirstKey(nCreationTime);

    if (!AddKeyPubKeyWithDB(batch, secret, pubkey)) {
        throw std::runtime_error(std::string(__func__) + ": AddKey failed");
    }
    return pubkey;
}